

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmwavebs.cpp
# Opt level: O3

void __thiscall mmWaveBS::~mmWaveBS(mmWaveBS *this)

{
  this->stop_thread = true;
  if ((this->the_thread)._M_id._M_thread != 0) {
    std::thread::join();
    if ((this->the_thread)._M_id._M_thread != 0) {
      std::terminate();
    }
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>,_std::_Select1st<std::pair<const_int,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>,_std::_Select1st<std::pair<const_int,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>_>
               *)&this->conflict);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::function<void_(const_cluster_head_msg_&)>_>,_std::_Select1st<std::pair<const_int,_std::function<void_(const_cluster_head_msg_&)>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::function<void_(const_cluster_head_msg_&)>_>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::function<void_(const_cluster_head_msg_&)>_>,_std::_Select1st<std::pair<const_int,_std::function<void_(const_cluster_head_msg_&)>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::function<void_(const_cluster_head_msg_&)>_>_>_>
               *)&this->clusterHead);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::function<void_(const_candidacy_msg_&)>_>,_std::_Select1st<std::pair<const_int,_std::function<void_(const_candidacy_msg_&)>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::function<void_(const_candidacy_msg_&)>_>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::function<void_(const_candidacy_msg_&)>_>,_std::_Select1st<std::pair<const_int,_std::function<void_(const_candidacy_msg_&)>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::function<void_(const_candidacy_msg_&)>_>_>_>
               *)this);
  return;
}

Assistant:

mmWaveBS::~mmWaveBS()
{
	stop_thread = true;
	if(the_thread.joinable()) 
		the_thread.join();
// 	std::cout << "Deconstructor " << __FILE__ << std::endl;
}